

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,io_context *io_context,string *address,string *port,bool port_reuse,
          int nominalBufferSize)

{
  bool in_stack_0000012f;
  string *in_stack_00000130;
  string *in_stack_00000138;
  io_context *in_stack_00000140;
  SocketFactory *in_stack_00000148;
  TcpServer *in_stack_00000150;
  int in_stack_00000160;
  SocketFactory *in_stack_ffffffffffffff90;
  
  SocketFactory::SocketFactory(in_stack_ffffffffffffff90);
  TcpServer(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
            in_stack_00000130,in_stack_0000012f,in_stack_00000160);
  SocketFactory::~SocketFactory((SocketFactory *)0x70ab8f);
  return;
}

Assistant:

TcpServer::TcpServer(
    asio::io_context& io_context,
    const std::string& address,
    const std::string& port,
    bool port_reuse,
    int nominalBufferSize) :
    TcpServer::TcpServer(
        SocketFactory(),
        io_context,
        address,
        port,
        port_reuse,
        nominalBufferSize)
{
}